

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

Span<unsigned_char> __thiscall bssl::DTLSIncomingMessage::msg(DTLSIncomingMessage *this)

{
  Span<unsigned_char> SVar1;
  Span<unsigned_char> local_30;
  DTLSIncomingMessage *local_20;
  DTLSIncomingMessage *this_local;
  
  local_20 = this;
  Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
            (&local_30,&this->data);
  SVar1 = Span<unsigned_char>::subspan(&local_30,0xc,0xffffffffffffffff);
  return SVar1;
}

Assistant:

Span<uint8_t> msg() { return Span(data).subspan(DTLS1_HM_HEADER_LENGTH); }